

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O2

bool __thiscall mahjong::MinipointCounter::isNoPointsHandSelfDrawn(MinipointCounter *this)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  pointer pMVar4;
  Meld it;
  Meld local_50;
  
  bVar2 = WiningState::isWinByDiscard(this->state);
  if (!bVar2) {
    pMVar4 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar1 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar2 = false;
    do {
      if (pMVar4 == pMVar1) {
        return bVar2;
      }
      Meld::Meld(&local_50,pMVar4);
      bVar3 = Meld::isOpen(&local_50);
      if ((bVar3) || (bVar3 = Meld::isTripletOrQuad(&local_50), bVar3)) {
        bVar3 = false;
      }
      else {
        bVar2 = Meld::isMultiWait(&local_50,this->hand->last_tile);
        bVar3 = true;
      }
      std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base
                ((_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&local_50);
      pMVar4 = pMVar4 + 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool MinipointCounter::isNoPointsHandSelfDrawn() const
{
	if (state.isWinByDiscard()) return false;

	auto is_multi_wait = false;
	for (auto it : hand.melds)
	{
		if (it.isOpen()) return false;
		if (it.isTripletOrQuad()) return false;

		is_multi_wait = it.isMultiWait(hand.last_tile);
	}

	return is_multi_wait;
}